

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

void SL::WS_LITE::
     write<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>,SL::WS_LITE::WSMessage>
               (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,WSMessage *msg)

{
  ulong u;
  unsigned_long_long uVar1;
  size_t sVar2;
  size_t sVar3;
  OpCode local_7a;
  byte local_79;
  ushort uStack_78;
  undefined5 uStack_76;
  undefined1 local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_79 = 0;
  uStack_78 = 0;
  uStack_76 = 0;
  local_71 = 0;
  local_7a = msg->code & 0xf | 0x80;
  u = msg->len;
  if (u < 0x7e) {
    local_79 = (byte)u | 0x80;
    sVar3 = 2;
  }
  else if (u < 0x10000) {
    uStack_78 = (ushort)u << 8 | (ushort)u >> 8;
    sVar3 = 4;
    local_79 = 0xfe;
  }
  else {
    uVar1 = hton<unsigned_long_long>(u);
    uStack_78 = (ushort)uVar1;
    uStack_76 = (undefined5)(uVar1 >> 0x10);
    local_71 = (undefined1)(uVar1 >> 0x38);
    local_79 = 0xff;
    if (0xfffffffe < msg->len) {
      __assert_fail("msg.len < UINT32_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
                    ,0x9e,
                    "void SL::WS_LITE::write(const SOCKETTYPE &, const SENDBUFFERTYPE &) [isServer = false, SOCKETTYPE = std::shared_ptr<SL::WS_LITE::WebSocket<false, asio::basic_stream_socket<asio::ip::tcp>>>, SENDBUFFERTYPE = SL::WS_LITE::WSMessage]"
                   );
    }
    sVar3 = 10;
  }
  writeexpire_from_now<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
            (socket,(seconds)(((((socket->
                                 super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->Parent).
                               super___shared_ptr<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->WriteTimeout).__r);
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  local_70._M_dataplus._M_p = (pointer)&local_7a;
  local_70._M_string_length = sVar3;
  sVar2 = asio::
          write<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffers_1,asio::detail::transfer_all_t>
                    (&((socket->
                       super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->Socket,&local_70,&ec,0);
  if (ec._M_value == 0) {
    if (sVar3 != sVar2) {
      __assert_fail("sendsize == bytes_transferred",
                    "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
                    ,0xa4,
                    "void SL::WS_LITE::write(const SOCKETTYPE &, const SENDBUFFERTYPE &) [isServer = false, SOCKETTYPE = std::shared_ptr<SL::WS_LITE::WebSocket<false, asio::basic_stream_socket<asio::ip::tcp>>>, SENDBUFFERTYPE = SL::WS_LITE::WSMessage]"
                   );
    }
    writeend<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>,SL::WS_LITE::WSMessage>
              (socket,msg,false);
  }
  else {
    (**(code **)(*(long *)ec._M_cat + 0x20))(&local_40);
    std::operator+(&local_70,"write header failed ",&local_40);
    handleclose<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
              (socket,0x3ea,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

inline void write(const SOCKETTYPE &socket, const SENDBUFFERTYPE &msg)
    {
        size_t sendsize = 0;
        unsigned char header[10] = {};

        setFin(header, 0xFF);
        set_MaskBitForSending(header, isServer);
        setOpCode(header, msg.code);
        setrsv1(header, 0x00);
        setrsv2(header, 0x00);
        setrsv3(header, 0x00);

        if (msg.len <= 125) {
            setpayloadLength1(header, hton(static_cast<unsigned char>(msg.len)));
            sendsize = 2;
        }
        else if (msg.len > USHRT_MAX) {
            setpayloadLength8(header, hton(static_cast<unsigned long long int>(msg.len)));
            setpayloadLength1(header, 127);
            sendsize = 10;
        }
        else {
            setpayloadLength2(header, hton(static_cast<unsigned short>(msg.len)));
            setpayloadLength1(header, 126);
            sendsize = 4;
        }

        assert(msg.len < UINT32_MAX);
        writeexpire_from_now<isServer>(socket, socket->Parent->WriteTimeout);
        std::error_code ec;
        auto bytes_transferred = asio::write(socket->Socket, asio::buffer(header, sendsize), ec);
        UNUSED(bytes_transferred);
        if (!ec) {
            assert(sendsize == bytes_transferred);
            writeend<isServer>(socket, msg, isServer);
        }
        else {
            handleclose(socket, 1002, "write header failed " + ec.message());
        }
    }